

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O3

BOOL Js::JavascriptOperators::GetProperty_InternalSimple
               (Var instance,RecyclableObject *object,PropertyId propertyId,Var *value,
               ScriptContext *requestContext)

{
  Type *pTVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  BOOL BVar5;
  undefined4 *puVar6;
  undefined4 extraout_var;
  RecyclableObject *pRVar7;
  Type *pTVar8;
  
  if (value == (Var *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x72f,"(value != nullptr)","value != nullptr");
    if (!bVar3) {
LAB_00aa9ca9:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  if (((object->type).ptr)->typeId != TypeIds_Null) {
    pTVar8 = &object->type;
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    do {
      iVar4 = (*(object->super_FinalizableObject).super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[0x12])
                        (object,instance,(ulong)(uint)propertyId,value,0,requestContext);
      if (iVar4 != 0) {
        if (iVar4 == 1) {
          return 1;
        }
        break;
      }
      BVar5 = RecyclableObject::SkipsPrototype(object);
      if (BVar5 != 0) break;
      pTVar1 = pTVar8->ptr;
      if ((pTVar1->flags & TypeFlagMask_HasSpecialPrototype) == TypeFlagMask_None) {
LAB_00aa9c62:
        object = (pTVar1->prototype).ptr;
      }
      else if (pTVar1->typeId == TypeIds_Proxy) {
        object = (pTVar1->prototype).ptr;
        if (object != (((((((pTVar1->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
                          scriptContext.ptr)->super_ScriptContextBase).javascriptLibrary)->
                      super_JavascriptLibraryBase).nullValue.ptr) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar6 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                      ,0x57a,
                                      "(type->GetPrototype() == instance->GetScriptContext()->GetLibrary()->GetNull())"
                                      ,
                                      "type->GetPrototype() == instance->GetScriptContext()->GetLibrary()->GetNull()"
                                     );
          if (bVar3) {
            *puVar6 = 0;
            goto LAB_00aa9c62;
          }
          goto LAB_00aa9ca9;
        }
      }
      else {
        iVar4 = (*(object->super_FinalizableObject).super_IRecyclerVisitedObject.
                  _vptr_IRecyclerVisitedObject[6])(object);
        object = (RecyclableObject *)CONCAT44(extraout_var,iVar4);
      }
      pTVar8 = &object->type;
    } while (((object->type).ptr)->typeId != TypeIds_Null);
  }
  pRVar7 = ScriptContext::GetMissingPropertyResult(requestContext);
  *value = pRVar7;
  return 0;
}

Assistant:

BOOL JavascriptOperators::GetProperty_InternalSimple(Var instance, RecyclableObject* object, PropertyId propertyId, _Outptr_result_maybenull_ Var* value, ScriptContext* requestContext)
    {
        BOOL foundProperty = FALSE;
        Assert(value != nullptr);

        while (!JavascriptOperators::IsNull(object))
        {
            PropertyQueryFlags result = object->GetPropertyQuery(instance, propertyId, value, nullptr, requestContext);
            if (result != PropertyQueryFlags::Property_NotFound)
            {
                foundProperty = JavascriptConversion::PropertyQueryFlagsToBoolean(result);
                break;
            }

            if (object->SkipsPrototype())
            {
                break;
            }

            object = JavascriptOperators::GetPrototypeNoTrap(object);
        }

        if (!foundProperty)
        {
            *value = requestContext->GetMissingPropertyResult();
        }

        return foundProperty;
    }